

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * Splash_abi_cxx11_(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  string *in_RDI;
  allocator<char> local_9;
  
  uVar3 = std::chrono::_V2::system_clock::now();
  uVar4 = ((ulong)uVar3 % 0x7fffffff + (ulong)((ulong)uVar3 % 0x7fffffff == 0)) * 0x41a7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar4 = (SUB168(auVar1 * ZEXT816(0x400000008001),8) >> 0xd & 0x7ffff) * -0x7fffffff + uVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             _ZL8splashes_rel +
             *(int *)(_ZL8splashes_rel +
                     (ulong)(uint)((int)uVar4 + SUB164(auVar2 * ZEXT816(0x2492492492492493),8) * -7)
                     * 4),&local_9);
  return in_RDI;
}

Assistant:

std::string Splash()
{
    std::default_random_engine randomizer;
    unsigned seed = (unsigned) std::chrono::system_clock::now().time_since_epoch().count();
    randomizer.seed(seed);
    unsigned index = randomizer() % (sizeof(splashes) / sizeof(const char*));
    return std::string(splashes[index]);
}